

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcS.c
# Opt level: O0

void Bmc_SuperBuildTents_rec
               (Gia_Man_t *p,int iObj,Vec_Int_t *vIns,Vec_Int_t *vCuts,Vec_Int_t *vFlops,
               Vec_Int_t *vObjs,Vec_Int_t *vRankIns,Vec_Int_t *vRankCuts,int Rank)

{
  int iVar1;
  Gia_Obj_t *pObj_00;
  Gia_Obj_t *pObj;
  Vec_Int_t *vObjs_local;
  Vec_Int_t *vFlops_local;
  Vec_Int_t *vCuts_local;
  Vec_Int_t *vIns_local;
  int iObj_local;
  Gia_Man_t *p_local;
  
  if ((iObj != 0) && (iVar1 = Gia_ObjIsTravIdCurrentId(p,iObj), iVar1 == 0)) {
    Gia_ObjSetTravIdCurrentId(p,iObj);
    pObj_00 = Gia_ManObj(p,iObj);
    if ((*(ulong *)pObj_00 >> 0x1e & 1) == 0) {
      *(ulong *)pObj_00 = *(ulong *)pObj_00 & 0xffffffffbfffffff | 0x40000000;
      iVar1 = Gia_ObjIsPi(p,pObj_00);
      if (iVar1 == 0) {
        iVar1 = Gia_ObjIsCi(pObj_00);
        if (iVar1 == 0) {
          iVar1 = Gia_ObjIsAnd(pObj_00);
          if (iVar1 == 0) {
            __assert_fail("Gia_ObjIsAnd(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmcS.c"
                          ,0x8a,
                          "void Bmc_SuperBuildTents_rec(Gia_Man_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                         );
          }
          iVar1 = Gia_ObjFaninId0(pObj_00,iObj);
          Bmc_SuperBuildTents_rec(p,iVar1,vIns,vCuts,vFlops,vObjs,vRankIns,vRankCuts,Rank);
          iVar1 = Gia_ObjFaninId1(pObj_00,iObj);
          Bmc_SuperBuildTents_rec(p,iVar1,vIns,vCuts,vFlops,vObjs,vRankIns,vRankCuts,Rank);
          Vec_IntPush(vObjs,iObj);
        }
        else {
          Vec_IntPush(vFlops,iObj);
        }
      }
      else {
        Vec_IntPush(vIns,iObj);
        Vec_IntPush(vRankIns,Rank);
        *(ulong *)pObj_00 = *(ulong *)pObj_00 & 0xbfffffffffffffff | 0x4000000000000000;
      }
    }
    else if ((*(ulong *)pObj_00 >> 0x3e & 1) != 0) {
      Vec_IntPush(vCuts,iObj);
      Vec_IntPush(vRankCuts,Rank);
      *(ulong *)pObj_00 = *(ulong *)pObj_00 & 0xbfffffffffffffff | 0x4000000000000000;
    }
  }
  return;
}

Assistant:

void Bmc_SuperBuildTents_rec( Gia_Man_t * p, int iObj, Vec_Int_t * vIns, Vec_Int_t * vCuts, Vec_Int_t * vFlops, Vec_Int_t * vObjs, Vec_Int_t * vRankIns, Vec_Int_t * vRankCuts, int Rank )
{
    Gia_Obj_t * pObj;
    if ( iObj == 0 )
        return;
    if ( Gia_ObjIsTravIdCurrentId(p, iObj) )
        return;
    Gia_ObjSetTravIdCurrentId(p, iObj);
    pObj = Gia_ManObj( p, iObj );
    if ( pObj->fMark0 )
    {
        if ( !pObj->fMark1 )
            return;
        Vec_IntPush( vCuts, iObj );
        Vec_IntPush( vRankCuts, Rank );
        pObj->fMark1 = 1;
        return;
    }
    pObj->fMark0 = 1;
    if ( Gia_ObjIsPi(p, pObj) )
    {
        Vec_IntPush( vIns, iObj );
        Vec_IntPush( vRankIns, Rank );
        pObj->fMark1 = 1;
        return;
    }
    if ( Gia_ObjIsCi(pObj) )
    {
        Vec_IntPush( vFlops, iObj );
        return;
    }
    assert( Gia_ObjIsAnd(pObj) );
    Bmc_SuperBuildTents_rec( p, Gia_ObjFaninId0(pObj, iObj), vIns, vCuts, vFlops, vObjs, vRankIns, vRankCuts, Rank );
    Bmc_SuperBuildTents_rec( p, Gia_ObjFaninId1(pObj, iObj), vIns, vCuts, vFlops, vObjs, vRankIns, vRankCuts, Rank );
    Vec_IntPush( vObjs, iObj );
}